

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlRenderer::DebugXmlRules
          (GdlRenderer *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur)

{
  pointer pcVar1;
  GdlRuleTable *pGVar2;
  ostream *poVar3;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"  <rules>\n",10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"linebreak","");
  pGVar2 = FindRuleTable(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pGVar2 != (GdlRuleTable *)0x0) {
    pcVar1 = (staPathToCur->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + staPathToCur->_M_string_length);
    GdlRuleTable::DebugXmlRules(pGVar2,pcman,strmOut,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"substitution","");
  pGVar2 = FindRuleTable(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (pGVar2 != (GdlRuleTable *)0x0) {
    pcVar1 = (staPathToCur->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + staPathToCur->_M_string_length);
    GdlRuleTable::DebugXmlRules(pGVar2,pcman,strmOut,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_nBidi == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)strmOut,"    <pass table=\"bidi\" index=\"",0x1e);
    poVar3 = (ostream *)std::ostream::operator<<(strmOut,this->m_ipassBidi + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" />\n",5);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"justification","");
  pGVar2 = FindRuleTable(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (pGVar2 != (GdlRuleTable *)0x0) {
    pcVar1 = (staPathToCur->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + staPathToCur->_M_string_length);
    GdlRuleTable::DebugXmlRules(pGVar2,pcman,strmOut,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"positioning","");
  pGVar2 = FindRuleTable(this,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (pGVar2 != (GdlRuleTable *)0x0) {
    pcVar1 = (staPathToCur->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,pcVar1 + staPathToCur->_M_string_length);
    GdlRuleTable::DebugXmlRules(pGVar2,pcman,strmOut,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"  </rules>\n\n",0xc);
  return;
}

Assistant:

void GdlRenderer::DebugXmlRules(GrcManager * pcman, std::ofstream & strmOut,
	std::string staPathToCur)
{
	strmOut << "  <rules>\n";

	GdlRuleTable * prultbl;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if (RawBidi() == kFullPass)
		strmOut << "    <pass table=\"bidi\" index=\"" << m_ipassBidi + 1 << "\" />\n";

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugXmlRules(pcman, strmOut, staPathToCur);

	strmOut << "  </rules>\n\n";
}